

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_discovery_lin.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* loader::discoverEnabledDrivers_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  size_t sVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  long lVar3;
  string substr;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  char *local_1a8 [4];
  int aiStack_188 [24];
  ios_base local_128 [264];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  __s = getenv("ZE_ENABLE_ALT_DRIVERS");
  if (__s == (char *)0x0) {
    lVar3 = 0;
    do {
      local_1a8[0] = *(char **)((long)&knownDriverNames + lVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>(in_RDI,local_1a8);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
  }
  else {
    paVar1 = &local_1c8.field_2;
    local_1c8._M_dataplus._M_p = (pointer)paVar1;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,__s,__s + sVar2);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1a8,(string *)&local_1c8,_S_out|_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if (*(int *)((long)aiStack_188 + *(long *)(local_1a8[0] + -0x18)) == 0) {
      do {
        local_1c8._M_string_length = 0;
        local_1c8.field_2._M_local_buf[0] = '\0';
        local_1c8._M_dataplus._M_p = (pointer)paVar1;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_1a8,(string *)&local_1c8,',');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>(in_RDI,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                   local_1c8.field_2._M_local_buf[0]) + 1);
        }
      } while (*(int *)((long)aiStack_188 + *(long *)(local_1a8[0] + -0x18)) == 0);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<DriverLibraryPath> discoverEnabledDrivers() {
  std::vector<DriverLibraryPath> enabledDrivers;
  const char *altDrivers = nullptr;

  // ZE_ENABLE_ALT_DRIVERS is for development/debug only
  altDrivers = getenv("ZE_ENABLE_ALT_DRIVERS");
  if (altDrivers == nullptr) {
    for (auto path : knownDriverNames) {
      enabledDrivers.emplace_back(path);
    }
  } else {
    std::stringstream ss(altDrivers);
    while (ss.good()) {
      std::string substr;
      getline(ss, substr, ',');
      enabledDrivers.emplace_back(substr);
    }
  }
  return enabledDrivers;
}